

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O1

void mat_tpose_vec(csc *A,c_float *x,c_float *y,c_int plus_eq,c_int skip_diag)

{
  long lVar1;
  c_int *pcVar2;
  long lVar3;
  c_int *pcVar4;
  c_float *pcVar5;
  long lVar6;
  long lVar7;
  c_float cVar8;
  double dVar9;
  
  if ((plus_eq == 0) && (0 < A->n)) {
    memset(y,0,A->n << 3);
  }
  lVar1 = A->n;
  pcVar2 = A->p;
  if (pcVar2[lVar1] != 0) {
    if (plus_eq == -1) {
      if (skip_diag == 0) {
        if (0 < lVar1) {
          lVar6 = 0;
          do {
            lVar7 = pcVar2[lVar6];
            lVar3 = pcVar2[lVar6 + 1];
            if (lVar7 < lVar3) {
              pcVar4 = A->i;
              pcVar5 = A->x;
              cVar8 = y[lVar6];
              do {
                cVar8 = cVar8 - pcVar5[lVar7] * x[pcVar4[lVar7]];
                y[lVar6] = cVar8;
                lVar7 = lVar7 + 1;
              } while (lVar3 != lVar7);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != lVar1);
        }
      }
      else if (0 < lVar1) {
        lVar6 = 0;
        do {
          lVar7 = pcVar2[lVar6];
          lVar3 = pcVar2[lVar6 + 1];
          if (lVar7 < lVar3) {
            pcVar4 = A->i;
            cVar8 = y[lVar6];
            do {
              dVar9 = 0.0;
              if (pcVar4[lVar7] != lVar6) {
                dVar9 = A->x[lVar7] * x[pcVar4[lVar7]];
              }
              cVar8 = cVar8 - dVar9;
              y[lVar6] = cVar8;
              lVar7 = lVar7 + 1;
            } while (lVar3 != lVar7);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar1);
      }
    }
    else if (skip_diag == 0) {
      if (0 < lVar1) {
        lVar6 = 0;
        do {
          lVar7 = pcVar2[lVar6];
          lVar3 = pcVar2[lVar6 + 1];
          if (lVar7 < lVar3) {
            pcVar4 = A->i;
            pcVar5 = A->x;
            cVar8 = y[lVar6];
            do {
              cVar8 = cVar8 + pcVar5[lVar7] * x[pcVar4[lVar7]];
              y[lVar6] = cVar8;
              lVar7 = lVar7 + 1;
            } while (lVar3 != lVar7);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar1);
      }
    }
    else if (0 < lVar1) {
      lVar6 = 0;
      do {
        lVar7 = pcVar2[lVar6];
        lVar3 = pcVar2[lVar6 + 1];
        if (lVar7 < lVar3) {
          pcVar4 = A->i;
          cVar8 = y[lVar6];
          do {
            dVar9 = 0.0;
            if (pcVar4[lVar7] != lVar6) {
              dVar9 = A->x[lVar7] * x[pcVar4[lVar7]];
            }
            cVar8 = cVar8 + dVar9;
            y[lVar6] = cVar8;
            lVar7 = lVar7 + 1;
          } while (lVar3 != lVar7);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar1);
    }
  }
  return;
}

Assistant:

void mat_tpose_vec(const csc *A, const c_float *x, c_float *y,
                   c_int plus_eq, c_int skip_diag) {
  c_int i, j, k;

  if (!plus_eq) {
    // y = 0
    for (i = 0; i < A->n; i++) {
      y[i] = 0;
    }
  }

  // if A is empty
  if (A->p[A->n] == 0) {
    return;
  }

  if (plus_eq == -1) {
    // y -=  A*x
    if (skip_diag) {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          i     = A->i[k];
          y[j] -= i == j ? 0 : A->x[k] * x[i];
        }
      }
    } else {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          y[j] -= A->x[k] * x[A->i[k]];
        }
      }
    }
  } else {
    // y +=  A*x
    if (skip_diag) {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          i     = A->i[k];
          y[j] += i == j ? 0 : A->x[k] * x[i];
        }
      }
    } else {
      for (j = 0; j < A->n; j++) {
        for (k = A->p[j]; k < A->p[j + 1]; k++) {
          y[j] += A->x[k] * x[A->i[k]];
        }
      }
    }
  }
}